

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t copy_string(archive_read *a,wchar_t len,wchar_t dist)

{
  ulong uVar1;
  rar5 *prVar2;
  long lVar3;
  ssize_t read_idx;
  ssize_t write_idx;
  wchar_t i;
  uint64_t write_ptr;
  ssize_t cmask;
  rar5 *rar;
  wchar_t dist_local;
  wchar_t len_local;
  archive_read *a_local;
  
  prVar2 = get_context(a);
  uVar1 = (prVar2->cstate).window_mask;
  lVar3 = (prVar2->cstate).write_ptr + (prVar2->cstate).solid_offset;
  if ((prVar2->cstate).window_buf == (uint8_t *)0x0) {
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    for (write_idx._4_4_ = L'\0'; write_idx._4_4_ < len; write_idx._4_4_ = write_idx._4_4_ + L'\x01'
        ) {
      (prVar2->cstate).window_buf[lVar3 + write_idx._4_4_ & uVar1] =
           (prVar2->cstate).window_buf[(lVar3 + write_idx._4_4_) - (long)dist & uVar1];
    }
    (prVar2->cstate).write_ptr = (long)len + (prVar2->cstate).write_ptr;
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int copy_string(struct archive_read* a, int len, int dist) {
	struct rar5* rar = get_context(a);
	const ssize_t cmask = rar->cstate.window_mask;
	const uint64_t write_ptr = rar->cstate.write_ptr +
	    rar->cstate.solid_offset;
	int i;

	if (rar->cstate.window_buf == NULL)
		return ARCHIVE_FATAL;

	/* The unpacker spends most of the time in this function. It would be
	 * a good idea to introduce some optimizations here.
	 *
	 * Just remember that this loop treats buffers that overlap differently
	 * than buffers that do not overlap. This is why a simple memcpy(3)
	 * call will not be enough. */

	for(i = 0; i < len; i++) {
		const ssize_t write_idx = (write_ptr + i) & cmask;
		const ssize_t read_idx = (write_ptr + i - dist) & cmask;
		rar->cstate.window_buf[write_idx] =
		    rar->cstate.window_buf[read_idx];
	}

	rar->cstate.write_ptr += len;
	return ARCHIVE_OK;
}